

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O3

void __thiscall
amrex::AmrMesh::InitAmrMesh
          (AmrMesh *this,int max_level_in,Vector<int,_std::allocator<int>_> *n_cell_in,
          Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *a_refrat,RealBox *rb,int coord,
          int *is_per)

{
  AmrInfo *ref;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *this_00;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *pVVar1;
  bool bVar2;
  undefined4 uVar3;
  pointer pIVar4;
  uint uVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  value_type_conflict *__val;
  ostream *poVar10;
  long lVar11;
  long lVar12;
  pointer pIVar13;
  ulong uVar14;
  int *piVar15;
  size_type sVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  int last_mgs;
  ParmParse pp;
  Vector<int,_std::allocator<int>_> ratios;
  Vector<int,_std::allocator<int>_> neb;
  vector<int,_std::allocator<int>_> local_288;
  int local_26c;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *local_268;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *local_260;
  ParmParse local_258;
  RealBox *local_200;
  undefined1 local_1f8 [16];
  pointer local_1e8;
  undefined1 local_1d8 [24];
  undefined8 local_1c0 [47];
  AmrInfo *local_48;
  Vector<int,_std::allocator<int>_> *local_40;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *local_38;
  
  local_26c = coord;
  local_200 = rb;
  local_38 = a_refrat;
  local_1d8._0_8_ = local_1d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"amr","");
  ParmParse::ParmParse(&local_258,(string *)local_1d8);
  if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
    operator_delete((void *)local_1d8._0_8_,CONCAT44(local_1d8._20_4_,local_1d8._16_4_) + 1);
  }
  ref = &this->super_AmrInfo;
  ParmParse::queryAdd<int,_0>(&local_258,"v",&ref->verbose);
  piVar15 = &(this->super_AmrInfo).max_level;
  local_48 = ref;
  local_40 = n_cell_in;
  if (max_level_in == -1) {
    ParmParse::get(&local_258,"max_level",piVar15,0);
    max_level_in = *piVar15;
  }
  else {
    *piVar15 = max_level_in;
  }
  local_268 = &(this->super_AmrInfo).blocking_factor;
  sVar16 = (size_type)(int)(max_level_in + 1U);
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&local_268->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,sVar16);
  this_00 = &(this->super_AmrInfo).max_grid_size;
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&this_00->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,sVar16);
  pVVar1 = &(this->super_AmrInfo).n_error_buf;
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&pVVar1->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,sVar16);
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::resize
            (&(this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,sVar16);
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::resize
            (&(this->dmap).
              super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,
             sVar16);
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize
            (&(this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,sVar16);
  if (-1 < max_level_in) {
    lVar11 = 0;
    do {
      pIVar13 = (pVVar1->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start;
      *(undefined8 *)((long)pIVar13->vect + lVar11) = 0x100000001;
      *(undefined4 *)((long)pIVar13->vect + lVar11 + 8) = 1;
      pIVar13 = (local_268->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start;
      *(undefined8 *)((long)pIVar13->vect + lVar11) = 0x800000008;
      *(undefined4 *)((long)pIVar13->vect + lVar11 + 8) = 8;
      pIVar13 = (this_00->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start;
      *(undefined8 *)((long)pIVar13->vect + lVar11) = 0x2000000020;
      *(undefined4 *)((long)pIVar13->vect + lVar11 + 8) = 0x20;
      lVar11 = lVar11 + 0xc;
    } while ((ulong)(max_level_in + 1U) * 0xc != lVar11);
  }
  local_260 = &(this->super_AmrInfo).ref_ratio;
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&local_260->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,
             (long)(this->super_AmrInfo).max_level);
  if (0 < (this->super_AmrInfo).max_level) {
    lVar11 = 8;
    lVar12 = 0;
    do {
      pIVar13 = (this->super_AmrInfo).ref_ratio.
                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start;
      *(undefined8 *)((long)pIVar13->vect + lVar11 + -8) = 0x200000002;
      *(undefined4 *)((long)pIVar13->vect + lVar11) = 2;
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0xc;
    } while (lVar12 < (this->super_AmrInfo).max_level);
  }
  ParmParse::queryAdd<int,_0>(&local_258,"n_proper",&(this->super_AmrInfo).n_proper);
  ParmParse::queryAdd<double,_0>(&local_258,"grid_eff",&(this->super_AmrInfo).grid_eff);
  uVar7 = ParmParse::countval(&local_258,"n_error_buf",-1);
  if (0 < (int)uVar7) {
    local_1d8._0_4_ = 0;
    local_1d8._4_4_ = 0;
    local_1d8._8_4_ = 0;
    local_1d8._12_4_ = 0;
    local_1d8._16_4_ = 0;
    local_1d8._20_4_ = 0;
    ParmParse::getarr(&local_258,"n_error_buf",(vector<int,_std::allocator<int>_> *)local_1d8,0,-1);
    iVar8 = (this->super_AmrInfo).max_level;
    uVar17 = iVar8 + 1;
    uVar5 = uVar7;
    if ((int)uVar17 < (int)uVar7) {
      uVar5 = uVar17;
    }
    if (-1 < iVar8) {
      uVar14 = 1;
      if (1 < (int)uVar5) {
        uVar14 = (ulong)uVar5;
      }
      lVar11 = 8;
      uVar18 = 0;
      do {
        uVar3 = *(undefined4 *)(CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + uVar18 * 4);
        pIVar13 = (pVVar1->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                  super__Vector_impl_data._M_start;
        *(undefined4 *)((long)pIVar13->vect + lVar11 + -8) = uVar3;
        *(undefined4 *)((long)pIVar13->vect + lVar11 + -4) = uVar3;
        *(undefined4 *)((long)pIVar13->vect + lVar11) = uVar3;
        uVar18 = uVar18 + 1;
        lVar11 = lVar11 + 0xc;
      } while (uVar14 != uVar18);
      iVar8 = (this->super_AmrInfo).max_level;
    }
    if ((int)uVar5 <= iVar8) {
      uVar18 = (ulong)uVar7;
      uVar14 = (long)(int)uVar17;
      if ((long)uVar18 < (long)(int)uVar17) {
        uVar14 = uVar18;
      }
      lVar12 = uVar14 - 1;
      lVar11 = uVar14 * 0xc + 8;
      do {
        uVar3 = *(undefined4 *)(CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + -4 + uVar18 * 4);
        pIVar13 = (this->super_AmrInfo).n_error_buf.
                  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                  super__Vector_impl_data._M_start;
        *(undefined4 *)((long)pIVar13->vect + lVar11 + -8) = uVar3;
        *(undefined4 *)((long)pIVar13->vect + lVar11 + -4) = uVar3;
        *(undefined4 *)((long)pIVar13->vect + lVar11) = uVar3;
        lVar12 = lVar12 + 1;
        lVar11 = lVar11 + 0xc;
      } while (lVar12 < (this->super_AmrInfo).max_level);
    }
    pvVar6 = (void *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,CONCAT44(local_1d8._20_4_,local_1d8._16_4_) - (long)pvVar6);
    }
  }
  uVar7 = ParmParse::countval(&local_258,"n_error_buf_x",-1);
  if (0 < (int)uVar7) {
    local_1d8._0_4_ = 0;
    local_1d8._4_4_ = 0;
    local_1d8._8_4_ = 0;
    local_1d8._12_4_ = 0;
    local_1d8._16_4_ = 0;
    local_1d8._20_4_ = 0;
    ParmParse::getarr(&local_258,"n_error_buf_x",(vector<int,_std::allocator<int>_> *)local_1d8,0,-1
                     );
    iVar8 = (this->super_AmrInfo).max_level;
    uVar17 = iVar8 + 1;
    uVar5 = uVar7;
    if ((int)uVar17 < (int)uVar7) {
      uVar5 = uVar17;
    }
    pvVar6 = (void *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
    if (-1 < iVar8) {
      pIVar13 = (pVVar1->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar14 = 1;
      if (1 < (int)uVar5) {
        uVar14 = (ulong)uVar5;
      }
      uVar18 = 0;
      do {
        pIVar13->vect[0] = *(int *)((long)pvVar6 + uVar18 * 4);
        uVar18 = uVar18 + 1;
        pIVar13 = pIVar13 + 1;
      } while (uVar14 != uVar18);
      iVar8 = (this->super_AmrInfo).max_level;
    }
    if ((int)uVar5 <= iVar8) {
      uVar14 = (long)(int)uVar17;
      if ((long)(ulong)uVar7 < (long)(int)uVar17) {
        uVar14 = (ulong)uVar7;
      }
      iVar8 = *(int *)((long)pvVar6 + (long)(int)uVar5 * 4 + -4);
      lVar11 = uVar14 - 1;
      pIVar13 = (pVVar1->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start + uVar14;
      do {
        pIVar13->vect[0] = iVar8;
        lVar11 = lVar11 + 1;
        pIVar13 = pIVar13 + 1;
      } while (lVar11 < (this->super_AmrInfo).max_level);
    }
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,CONCAT44(local_1d8._20_4_,local_1d8._16_4_) - (long)pvVar6);
    }
  }
  uVar7 = ParmParse::countval(&local_258,"n_error_buf_y",-1);
  if (0 < (int)uVar7) {
    local_1d8._0_4_ = 0;
    local_1d8._4_4_ = 0;
    local_1d8._8_4_ = 0;
    local_1d8._12_4_ = 0;
    local_1d8._16_4_ = 0;
    local_1d8._20_4_ = 0;
    ParmParse::getarr(&local_258,"n_error_buf_y",(vector<int,_std::allocator<int>_> *)local_1d8,0,-1
                     );
    iVar8 = (this->super_AmrInfo).max_level;
    uVar17 = iVar8 + 1;
    uVar5 = uVar7;
    if ((int)uVar17 < (int)uVar7) {
      uVar5 = uVar17;
    }
    pvVar6 = (void *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
    if (-1 < iVar8) {
      uVar14 = 1;
      if (1 < (int)uVar5) {
        uVar14 = (ulong)uVar5;
      }
      piVar15 = ((pVVar1->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start)->vect + 1;
      uVar18 = 0;
      do {
        *piVar15 = *(int *)((long)pvVar6 + uVar18 * 4);
        uVar18 = uVar18 + 1;
        piVar15 = piVar15 + 3;
      } while (uVar14 != uVar18);
      iVar8 = (this->super_AmrInfo).max_level;
    }
    if ((int)uVar5 <= iVar8) {
      uVar14 = (long)(int)uVar17;
      if ((long)(ulong)uVar7 < (long)(int)uVar17) {
        uVar14 = (ulong)uVar7;
      }
      iVar8 = *(int *)((long)pvVar6 + (long)(int)uVar5 * 4 + -4);
      lVar11 = uVar14 - 1;
      piVar15 = (pVVar1->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start[uVar14].vect + 1;
      do {
        *piVar15 = iVar8;
        lVar11 = lVar11 + 1;
        piVar15 = piVar15 + 3;
      } while (lVar11 < (this->super_AmrInfo).max_level);
    }
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,CONCAT44(local_1d8._20_4_,local_1d8._16_4_) - (long)pvVar6);
    }
  }
  uVar7 = ParmParse::countval(&local_258,"n_error_buf_z",-1);
  if (0 < (int)uVar7) {
    local_1d8._0_4_ = 0;
    local_1d8._4_4_ = 0;
    local_1d8._8_4_ = 0;
    local_1d8._12_4_ = 0;
    local_1d8._16_4_ = 0;
    local_1d8._20_4_ = 0;
    ParmParse::getarr(&local_258,"n_error_buf_z",(vector<int,_std::allocator<int>_> *)local_1d8,0,-1
                     );
    iVar8 = (this->super_AmrInfo).max_level;
    uVar17 = iVar8 + 1;
    uVar5 = uVar7;
    if ((int)uVar17 < (int)uVar7) {
      uVar5 = uVar17;
    }
    pvVar6 = (void *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
    if (-1 < iVar8) {
      uVar14 = 1;
      if (1 < (int)uVar5) {
        uVar14 = (ulong)uVar5;
      }
      piVar15 = ((pVVar1->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start)->vect + 2;
      uVar18 = 0;
      do {
        *piVar15 = *(int *)((long)pvVar6 + uVar18 * 4);
        uVar18 = uVar18 + 1;
        piVar15 = piVar15 + 3;
      } while (uVar14 != uVar18);
      iVar8 = (this->super_AmrInfo).max_level;
    }
    if ((int)uVar5 <= iVar8) {
      uVar14 = (long)(int)uVar17;
      if ((long)(ulong)uVar7 < (long)(int)uVar17) {
        uVar14 = (ulong)uVar7;
      }
      iVar8 = *(int *)((long)pvVar6 + (long)(int)uVar5 * 4 + -4);
      lVar11 = uVar14 - 1;
      piVar15 = (pVVar1->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start[uVar14].vect + 2;
      do {
        *piVar15 = iVar8;
        lVar11 = lVar11 + 1;
        piVar15 = piVar15 + 3;
      } while (lVar11 < (this->super_AmrInfo).max_level);
    }
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,CONCAT44(local_1d8._20_4_,local_1d8._16_4_) - (long)pvVar6);
    }
  }
  pVVar1 = local_38;
  uVar7 = (this->super_AmrInfo).max_level;
  if (0 < (int)uVar7) {
    sVar16 = (ulong)uVar7 * 3;
    std::vector<int,_std::allocator<int>_>::vector(&local_288,sVar16,(allocator_type *)local_1d8);
    iVar8 = ParmParse::queryarr(&local_258,"ref_ratio_vect",&local_288,0,(int)sVar16);
    local_1f8 = (undefined1  [16])0x0;
    local_1e8 = (pointer)0x0;
    iVar9 = ParmParse::queryarr(&local_258,"ref_ratio",
                                (vector<int,_std::allocator<int>_> *)local_1f8,0,-1);
    if (iVar8 == 1 && iVar9 == 1) {
      Abort_host("Only input *either* ref_ratio or ref_ratio_vect");
    }
    else if (iVar8 == 1) {
      if (0 < (this->super_AmrInfo).max_level) {
        pIVar13 = (local_260->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar11 = 0;
        lVar12 = 0;
        do {
          lVar19 = 0;
          do {
            pIVar13->vect[lVar19] =
                 local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)lVar12 + lVar19];
            lVar19 = lVar19 + 1;
          } while (lVar19 != 3);
          lVar11 = lVar11 + 1;
          pIVar13 = pIVar13 + 1;
          lVar12 = (long)(int)lVar12 + 3;
        } while (lVar11 < (this->super_AmrInfo).max_level);
      }
    }
    else if (iVar9 == 1) {
      uVar7 = (uint)((ulong)(local_1f8._8_8_ - local_1f8._0_8_) >> 2);
      iVar8 = (this->super_AmrInfo).max_level;
      if (0 < iVar8 && 0 < (int)uVar7) {
        piVar15 = ((local_260->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                   super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                   super__Vector_impl_data._M_start)->vect + 2;
        uVar14 = 1;
        do {
          iVar8 = *(int *)(local_1f8._0_8_ + (uVar14 - 1) * 4);
          ((IntVect *)(piVar15 + -2))->vect[0] = iVar8;
          piVar15[-1] = iVar8;
          *piVar15 = iVar8;
          iVar8 = (this->super_AmrInfo).max_level;
          if ((uVar7 & 0x7fffffff) <= uVar14) break;
          piVar15 = piVar15 + 3;
          bVar2 = (long)uVar14 < (long)iVar8;
          uVar14 = uVar14 + 1;
        } while (bVar2);
      }
      if ((int)uVar7 < iVar8) {
        lVar11 = (long)(int)uVar7;
        piVar15 = (local_260->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar11].vect + 2;
        do {
          iVar8 = *(int *)(local_1f8._8_8_ + -4);
          ((IntVect *)(piVar15 + -2))->vect[0] = iVar8;
          piVar15[-1] = iVar8;
          *piVar15 = iVar8;
          lVar11 = lVar11 + 1;
          piVar15 = piVar15 + 3;
        } while (lVar11 < (this->super_AmrInfo).max_level);
      }
    }
    else if (local_48->verbose != 0) {
      poVar10 = OutStream();
      local_1d8._0_4_ = *(int *)(DAT_00816950 + -0x30);
      local_1d8._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
      local_1d8._8_4_ = SUB84(poVar10,0);
      local_1d8._12_4_ = (undefined4)((ulong)poVar10 >> 0x20);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d8 + 0x10));
      *(undefined8 *)
       ((long)local_1c0 + *(long *)(CONCAT44(local_1d8._20_4_,local_1d8._16_4_) + -0x18)) =
           *(undefined8 *)
            ((long)CONCAT44(local_1d8._12_4_,local_1d8._8_4_) +
            *(long *)(*(long *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_) + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1d8 + 0x10),"Using default ref_ratio = 2 at all levels\n",0x2a);
      Print::~Print((Print *)local_1d8);
    }
    if ((pointer)local_1f8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1f8._0_8_,(long)local_1e8 - local_1f8._0_8_);
    }
    if (local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pIVar13 = (pVVar1->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pIVar4 = (pVVar1->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((pIVar13 != pIVar4 && -1 < (long)pIVar13 - (long)pIVar4) &&
       (0 < (this->super_AmrInfo).max_level)) {
      lVar11 = 0;
      lVar12 = 0;
      do {
        pIVar13 = (pVVar1->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pIVar4 = (this->super_AmrInfo).ref_ratio.
                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(undefined4 *)((long)pIVar4->vect + lVar11 + 8) =
             *(undefined4 *)((long)pIVar13->vect + lVar11 + 8);
        *(undefined8 *)((long)pIVar4->vect + lVar11) = *(undefined8 *)((long)pIVar13->vect + lVar11)
        ;
        lVar12 = lVar12 + 1;
        lVar11 = lVar11 + 0xc;
      } while (lVar12 < (this->super_AmrInfo).max_level);
    }
  }
  iVar8 = ParmParse::countval(&local_258,"max_grid_size",-1);
  if (0 < iVar8) {
    local_1d8._0_4_ = 0;
    local_1d8._4_4_ = 0;
    local_1d8._8_4_ = 0;
    local_1d8._12_4_ = 0;
    local_1d8._16_4_ = 0;
    local_1d8._20_4_ = 0;
    ParmParse::getarr(&local_258,"max_grid_size",(vector<int,_std::allocator<int>_> *)local_1d8,0,-1
                     );
    local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)CONCAT44(local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             *(undefined4 *)(CONCAT44(local_1d8._12_4_,local_1d8._8_4_) + -4));
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_1d8,
               (long)(this->super_AmrInfo).max_level + 1,(value_type_conflict *)&local_288);
    SetMaxGridSize(this,(Vector<int,_std::allocator<int>_> *)local_1d8);
    if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1d8._0_8_,
                      CONCAT44(local_1d8._20_4_,local_1d8._16_4_) - local_1d8._0_8_);
    }
  }
  uVar7 = ParmParse::countval(&local_258,"max_grid_size_x",-1);
  if (0 < (int)uVar7) {
    local_1d8._0_4_ = 0;
    local_1d8._4_4_ = 0;
    local_1d8._8_4_ = 0;
    local_1d8._12_4_ = 0;
    local_1d8._16_4_ = 0;
    local_1d8._20_4_ = 0;
    ParmParse::getarr(&local_258,"max_grid_size_x",(vector<int,_std::allocator<int>_> *)local_1d8,0,
                      -1);
    iVar8 = (this->super_AmrInfo).max_level;
    uVar17 = iVar8 + 1;
    uVar5 = uVar7;
    if ((int)uVar17 < (int)uVar7) {
      uVar5 = uVar17;
    }
    pvVar6 = (void *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
    if (-1 < iVar8) {
      pIVar13 = (this_00->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar14 = 1;
      if (1 < (int)uVar5) {
        uVar14 = (ulong)uVar5;
      }
      uVar18 = 0;
      do {
        pIVar13->vect[0] = *(int *)((long)pvVar6 + uVar18 * 4);
        uVar18 = uVar18 + 1;
        pIVar13 = pIVar13 + 1;
      } while (uVar14 != uVar18);
      iVar8 = (this->super_AmrInfo).max_level;
    }
    if ((int)uVar5 <= iVar8) {
      uVar14 = (long)(int)uVar17;
      if ((long)(ulong)uVar7 < (long)(int)uVar17) {
        uVar14 = (ulong)uVar7;
      }
      iVar8 = *(int *)((long)pvVar6 + (long)(int)uVar5 * 4 + -4);
      lVar11 = uVar14 - 1;
      pIVar13 = (this_00->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start + uVar14;
      do {
        pIVar13->vect[0] = iVar8;
        lVar11 = lVar11 + 1;
        pIVar13 = pIVar13 + 1;
      } while (lVar11 < (this->super_AmrInfo).max_level);
    }
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,CONCAT44(local_1d8._20_4_,local_1d8._16_4_) - (long)pvVar6);
    }
  }
  uVar7 = ParmParse::countval(&local_258,"max_grid_size_y",-1);
  if (0 < (int)uVar7) {
    local_1d8._0_4_ = 0;
    local_1d8._4_4_ = 0;
    local_1d8._8_4_ = 0;
    local_1d8._12_4_ = 0;
    local_1d8._16_4_ = 0;
    local_1d8._20_4_ = 0;
    ParmParse::getarr(&local_258,"max_grid_size_y",(vector<int,_std::allocator<int>_> *)local_1d8,0,
                      -1);
    iVar8 = (this->super_AmrInfo).max_level;
    uVar17 = iVar8 + 1;
    uVar5 = uVar7;
    if ((int)uVar17 < (int)uVar7) {
      uVar5 = uVar17;
    }
    pvVar6 = (void *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
    if (-1 < iVar8) {
      uVar14 = 1;
      if (1 < (int)uVar5) {
        uVar14 = (ulong)uVar5;
      }
      piVar15 = ((this_00->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start)->vect + 1;
      uVar18 = 0;
      do {
        *piVar15 = *(int *)((long)pvVar6 + uVar18 * 4);
        uVar18 = uVar18 + 1;
        piVar15 = piVar15 + 3;
      } while (uVar14 != uVar18);
      iVar8 = (this->super_AmrInfo).max_level;
    }
    if ((int)uVar5 <= iVar8) {
      uVar14 = (long)(int)uVar17;
      if ((long)(ulong)uVar7 < (long)(int)uVar17) {
        uVar14 = (ulong)uVar7;
      }
      iVar8 = *(int *)((long)pvVar6 + (long)(int)uVar5 * 4 + -4);
      lVar11 = uVar14 - 1;
      piVar15 = (this_00->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start[uVar14].vect + 1;
      do {
        *piVar15 = iVar8;
        lVar11 = lVar11 + 1;
        piVar15 = piVar15 + 3;
      } while (lVar11 < (this->super_AmrInfo).max_level);
    }
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,CONCAT44(local_1d8._20_4_,local_1d8._16_4_) - (long)pvVar6);
    }
  }
  uVar7 = ParmParse::countval(&local_258,"max_grid_size_z",-1);
  if (0 < (int)uVar7) {
    local_1d8._0_4_ = 0;
    local_1d8._4_4_ = 0;
    local_1d8._8_4_ = 0;
    local_1d8._12_4_ = 0;
    local_1d8._16_4_ = 0;
    local_1d8._20_4_ = 0;
    ParmParse::getarr(&local_258,"max_grid_size_z",(vector<int,_std::allocator<int>_> *)local_1d8,0,
                      -1);
    iVar8 = (this->super_AmrInfo).max_level;
    uVar17 = iVar8 + 1;
    uVar5 = uVar7;
    if ((int)uVar17 < (int)uVar7) {
      uVar5 = uVar17;
    }
    pvVar6 = (void *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
    if (-1 < iVar8) {
      uVar14 = 1;
      if (1 < (int)uVar5) {
        uVar14 = (ulong)uVar5;
      }
      piVar15 = ((this_00->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start)->vect + 2;
      uVar18 = 0;
      do {
        *piVar15 = *(int *)((long)pvVar6 + uVar18 * 4);
        uVar18 = uVar18 + 1;
        piVar15 = piVar15 + 3;
      } while (uVar14 != uVar18);
      iVar8 = (this->super_AmrInfo).max_level;
    }
    if ((int)uVar5 <= iVar8) {
      uVar14 = (long)(int)uVar17;
      if ((long)(ulong)uVar7 < (long)(int)uVar17) {
        uVar14 = (ulong)uVar7;
      }
      iVar8 = *(int *)((long)pvVar6 + (long)(int)uVar5 * 4 + -4);
      lVar11 = uVar14 - 1;
      piVar15 = (this_00->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start[uVar14].vect + 2;
      do {
        *piVar15 = iVar8;
        lVar11 = lVar11 + 1;
        piVar15 = piVar15 + 3;
      } while (lVar11 < (this->super_AmrInfo).max_level);
    }
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,CONCAT44(local_1d8._20_4_,local_1d8._16_4_) - (long)pvVar6);
    }
  }
  iVar8 = ParmParse::countval(&local_258,"blocking_factor",-1);
  if (0 < iVar8) {
    local_1d8._0_4_ = 0;
    local_1d8._4_4_ = 0;
    local_1d8._8_4_ = 0;
    local_1d8._12_4_ = 0;
    local_1d8._16_4_ = 0;
    local_1d8._20_4_ = 0;
    ParmParse::getarr(&local_258,"blocking_factor",(vector<int,_std::allocator<int>_> *)local_1d8,0,
                      -1);
    local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)CONCAT44(local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             *(undefined4 *)(CONCAT44(local_1d8._12_4_,local_1d8._8_4_) + -4));
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_1d8,
               (long)(this->super_AmrInfo).max_level + 1,(value_type_conflict *)&local_288);
    SetBlockingFactor(this,(Vector<int,_std::allocator<int>_> *)local_1d8);
    if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1d8._0_8_,
                      CONCAT44(local_1d8._20_4_,local_1d8._16_4_) - local_1d8._0_8_);
    }
  }
  uVar7 = ParmParse::countval(&local_258,"blocking_factor_x",-1);
  if (0 < (int)uVar7) {
    local_1d8._0_4_ = 0;
    local_1d8._4_4_ = 0;
    local_1d8._8_4_ = 0;
    local_1d8._12_4_ = 0;
    local_1d8._16_4_ = 0;
    local_1d8._20_4_ = 0;
    ParmParse::getarr(&local_258,"blocking_factor_x",(vector<int,_std::allocator<int>_> *)local_1d8,
                      0,-1);
    iVar8 = (this->super_AmrInfo).max_level;
    uVar17 = iVar8 + 1;
    uVar5 = uVar7;
    if ((int)uVar17 < (int)uVar7) {
      uVar5 = uVar17;
    }
    pvVar6 = (void *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
    if (-1 < iVar8) {
      pIVar13 = (local_268->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar14 = 1;
      if (1 < (int)uVar5) {
        uVar14 = (ulong)uVar5;
      }
      uVar18 = 0;
      do {
        pIVar13->vect[0] = *(int *)((long)pvVar6 + uVar18 * 4);
        uVar18 = uVar18 + 1;
        pIVar13 = pIVar13 + 1;
      } while (uVar14 != uVar18);
      iVar8 = (this->super_AmrInfo).max_level;
    }
    if ((int)uVar5 <= iVar8) {
      uVar14 = (long)(int)uVar17;
      if ((long)(ulong)uVar7 < (long)(int)uVar17) {
        uVar14 = (ulong)uVar7;
      }
      iVar8 = *(int *)((long)pvVar6 + (long)(int)uVar5 * 4 + -4);
      lVar11 = uVar14 - 1;
      pIVar13 = (local_268->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start + uVar14;
      do {
        pIVar13->vect[0] = iVar8;
        lVar11 = lVar11 + 1;
        pIVar13 = pIVar13 + 1;
      } while (lVar11 < (this->super_AmrInfo).max_level);
    }
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,CONCAT44(local_1d8._20_4_,local_1d8._16_4_) - (long)pvVar6);
    }
  }
  uVar7 = ParmParse::countval(&local_258,"blocking_factor_y",-1);
  if (0 < (int)uVar7) {
    local_1d8._0_4_ = 0;
    local_1d8._4_4_ = 0;
    local_1d8._8_4_ = 0;
    local_1d8._12_4_ = 0;
    local_1d8._16_4_ = 0;
    local_1d8._20_4_ = 0;
    ParmParse::getarr(&local_258,"blocking_factor_y",(vector<int,_std::allocator<int>_> *)local_1d8,
                      0,-1);
    iVar8 = (this->super_AmrInfo).max_level;
    uVar17 = iVar8 + 1;
    uVar5 = uVar7;
    if ((int)uVar17 < (int)uVar7) {
      uVar5 = uVar17;
    }
    pvVar6 = (void *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
    if (-1 < iVar8) {
      uVar14 = 1;
      if (1 < (int)uVar5) {
        uVar14 = (ulong)uVar5;
      }
      piVar15 = ((local_268->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start)->vect + 1;
      uVar18 = 0;
      do {
        *piVar15 = *(int *)((long)pvVar6 + uVar18 * 4);
        uVar18 = uVar18 + 1;
        piVar15 = piVar15 + 3;
      } while (uVar14 != uVar18);
      iVar8 = (this->super_AmrInfo).max_level;
    }
    if ((int)uVar5 <= iVar8) {
      uVar14 = (long)(int)uVar17;
      if ((long)(ulong)uVar7 < (long)(int)uVar17) {
        uVar14 = (ulong)uVar7;
      }
      iVar8 = *(int *)((long)pvVar6 + (long)(int)uVar5 * 4 + -4);
      lVar11 = uVar14 - 1;
      piVar15 = (local_268->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start[uVar14].vect + 1;
      do {
        *piVar15 = iVar8;
        lVar11 = lVar11 + 1;
        piVar15 = piVar15 + 3;
      } while (lVar11 < (this->super_AmrInfo).max_level);
    }
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,CONCAT44(local_1d8._20_4_,local_1d8._16_4_) - (long)pvVar6);
    }
  }
  uVar7 = ParmParse::countval(&local_258,"blocking_factor_z",-1);
  if (0 < (int)uVar7) {
    local_1d8._0_4_ = 0;
    local_1d8._4_4_ = 0;
    local_1d8._8_4_ = 0;
    local_1d8._12_4_ = 0;
    local_1d8._16_4_ = 0;
    local_1d8._20_4_ = 0;
    ParmParse::getarr(&local_258,"blocking_factor_z",(vector<int,_std::allocator<int>_> *)local_1d8,
                      0,-1);
    iVar8 = (this->super_AmrInfo).max_level;
    uVar17 = iVar8 + 1;
    uVar5 = uVar7;
    if ((int)uVar17 < (int)uVar7) {
      uVar5 = uVar17;
    }
    pvVar6 = (void *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
    if (-1 < iVar8) {
      uVar14 = 1;
      if (1 < (int)uVar5) {
        uVar14 = (ulong)uVar5;
      }
      piVar15 = ((local_268->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start)->vect + 2;
      uVar18 = 0;
      do {
        *piVar15 = *(int *)((long)pvVar6 + uVar18 * 4);
        uVar18 = uVar18 + 1;
        piVar15 = piVar15 + 3;
      } while (uVar14 != uVar18);
      iVar8 = (this->super_AmrInfo).max_level;
    }
    if ((int)uVar5 <= iVar8) {
      uVar14 = (long)(int)uVar17;
      if ((long)(ulong)uVar7 < (long)(int)uVar17) {
        uVar14 = (ulong)uVar7;
      }
      iVar8 = *(int *)((long)pvVar6 + (long)(int)uVar5 * 4 + -4);
      lVar11 = uVar14 - 1;
      piVar15 = (local_268->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start[uVar14].vect + 2;
      do {
        *piVar15 = iVar8;
        lVar11 = lVar11 + 1;
        piVar15 = piVar15 + 3;
      } while (lVar11 < (this->super_AmrInfo).max_level);
    }
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,CONCAT44(local_1d8._20_4_,local_1d8._16_4_) - (long)pvVar6);
    }
  }
  local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(0xc);
  local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 3;
  *local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 0;
  local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [1] = 0;
  local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [2] = 0;
  piVar15 = (local_40->super_vector<int,_std::allocator<int>_>).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (*piVar15 == -1) {
    ParmParse::getarr(&local_258,"n_cell",&local_288,0,3);
  }
  else {
    lVar11 = 0;
    do {
      local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11] = piVar15[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
  }
  local_1d8._20_4_ =
       local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start[2] + -1;
  local_1d8._12_4_ =
       (int)*(undefined8 *)
             local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start + -1;
  local_1d8._16_4_ =
       (int)((ulong)*(undefined8 *)
                     local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 0x20) + -1;
  local_1d8._0_4_ = 0;
  local_1d8._4_4_ = 0;
  local_1d8._8_4_ = 0;
  local_1c0[0]._0_4_ = 0;
  if (-1 < (this->super_AmrInfo).max_level) {
    Geometry::define((this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                     super__Vector_impl_data._M_start,(Box *)local_1d8,local_200,local_26c,is_per);
    if (0 < (this->super_AmrInfo).max_level) {
      lVar19 = 200;
      lVar12 = 8;
      lVar11 = 0;
      do {
        pIVar13 = (local_260->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar8 = *(int *)((long)pIVar13->vect + lVar12 + -8);
        if (((iVar8 != 1) || (*(int *)((long)pIVar13->vect + lVar12 + -4) != 1)) ||
           (*(int *)((long)pIVar13->vect + lVar12) != 1)) {
          local_1d8._0_4_ = iVar8 * local_1d8._0_4_;
          local_1d8._4_4_ = local_1d8._4_4_ * *(int *)((long)pIVar13->vect + lVar12 + -4);
          local_1d8._8_4_ = local_1d8._8_4_ * *(int *)((long)pIVar13->vect + lVar12);
          uVar7 = (uint)(((undefined4)local_1c0[0] & 2) == 0);
          uVar17 = (uint)(((undefined4)local_1c0[0] & 4) == 0);
          local_1d8._12_4_ =
               (local_1d8._12_4_ + (~(undefined4)local_1c0[0] & 1)) *
               *(int *)((long)pIVar13->vect + lVar12 + -8) - (~(undefined4)local_1c0[0] & 1);
          local_1d8._16_4_ =
               (local_1d8._16_4_ + uVar7) * *(int *)((long)pIVar13->vect + lVar12 + -4) - uVar7;
          local_1d8._20_4_ =
               (local_1d8._20_4_ + uVar17) * *(int *)((long)pIVar13->vect + lVar12) - uVar17;
        }
        lVar11 = lVar11 + 1;
        Geometry::define((Geometry *)
                         ((long)(((this->geom).
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset
                         + lVar19 + 0xfffffffffffffff8U),(Box *)local_1d8,local_200,local_26c,is_per
                        );
        lVar19 = lVar19 + 200;
        lVar12 = lVar12 + 0xc;
      } while (lVar11 < (this->super_AmrInfo).max_level);
    }
    if (local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) goto LAB_005a4493;
  }
  operator_delete(local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
LAB_005a4493:
  ParmParse::queryAdd<bool,_0>
            (&local_258,"refine_grid_layout",&(this->super_AmrInfo).refine_grid_layout);
  bVar2 = (this->super_AmrInfo).refine_grid_layout;
  (this->super_AmrInfo).refine_grid_layout_dims.vect[0] = (uint)bVar2;
  (this->super_AmrInfo).refine_grid_layout_dims.vect[1] = (uint)bVar2;
  (this->super_AmrInfo).refine_grid_layout_dims.vect[2] = (uint)bVar2;
  ParmParse::queryAdd<int,_0>
            (&local_258,"refine_grid_layout_x",(this->super_AmrInfo).refine_grid_layout_dims.vect);
  ParmParse::queryAdd<int,_0>
            (&local_258,"refine_grid_layout_y",
             (this->super_AmrInfo).refine_grid_layout_dims.vect + 1);
  ParmParse::queryAdd<int,_0>
            (&local_258,"refine_grid_layout_z",
             (this->super_AmrInfo).refine_grid_layout_dims.vect + 2);
  (this->super_AmrInfo).refine_grid_layout =
       ((this->super_AmrInfo).refine_grid_layout_dims.vect[1] != 0 ||
       (this->super_AmrInfo).refine_grid_layout_dims.vect[0] != 0) ||
       (this->super_AmrInfo).refine_grid_layout_dims.vect[2] != 0;
  ParmParse::queryAdd<bool,_0>(&local_258,"check_input",&(this->super_AmrInfo).check_input);
  *(undefined4 *)&(this->super_AmrInfo).field_0x8c = 0xffffffff;
  if ((this->super_AmrInfo).check_input == true) {
    checkInput(this);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_258);
  return;
}

Assistant:

void
AmrMesh::InitAmrMesh (int max_level_in, const Vector<int>& n_cell_in,
                      Vector<IntVect> a_refrat, const RealBox* rb,
                      int coord, const int* is_per)
{
    ParmParse pp("amr");

    pp.queryAdd("v",verbose);

    if (max_level_in == -1) {
       pp.get("max_level", max_level);
    } else {
       max_level = max_level_in;
    }

    int nlev = max_level + 1;

    blocking_factor.resize(nlev);
    max_grid_size.resize(nlev);
    n_error_buf.resize(nlev);

    geom.resize(nlev);
    dmap.resize(nlev);
    grids.resize(nlev);

    for (int i = 0; i < nlev; ++i) {
        n_error_buf[i]     = IntVect{AMREX_D_DECL(1,1,1)};
        blocking_factor[i] = IntVect{AMREX_D_DECL(8,8,8)};
        max_grid_size[i]   = (AMREX_SPACEDIM == 2) ? IntVect{AMREX_D_DECL(128,128,128)}
                                                   : IntVect{AMREX_D_DECL(32,32,32)};
    }

    // Make the default ref_ratio = 2 for all levels.
    ref_ratio.resize(max_level);
    for (int i = 0; i < max_level; ++i)
    {
      ref_ratio[i] = 2 * IntVect::TheUnitVector();
    }

    pp.queryAdd("n_proper",n_proper);
    pp.queryAdd("grid_eff",grid_eff);
    int cnt = pp.countval("n_error_buf");
    if (cnt > 0) {
        Vector<int> neb;
        pp.getarr("n_error_buf",neb);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            n_error_buf[i] = IntVect(neb[i]);
        }
        for (int i = n; i <= max_level; ++i) {
            n_error_buf[i] = IntVect(neb[cnt-1]);
        }
    }

    cnt = pp.countval("n_error_buf_x");
    if (cnt > 0) {
        int idim = 0;
        Vector<int> neb;
        pp.getarr("n_error_buf_x",neb);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            n_error_buf[i][idim] = neb[i];
        }
        for (int i = n; i <= max_level; ++i) {
            n_error_buf[i][idim] = neb[n-1];
        }
    }

#if (AMREX_SPACEDIM > 1)
    cnt = pp.countval("n_error_buf_y");
    if (cnt > 0) {
        int idim = 1;
        Vector<int> neb;
        pp.getarr("n_error_buf_y",neb);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            n_error_buf[i][idim] = neb[i];
        }
        for (int i = n; i <= max_level; ++i) {
            n_error_buf[i][idim] = neb[n-1];
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    cnt = pp.countval("n_error_buf_z");
    if (cnt > 0) {
        int idim = 2;
        Vector<int> neb;
        pp.getarr("n_error_buf_z",neb);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            n_error_buf[i][idim] = neb[i];
        }
        for (int i = n; i <= max_level; ++i) {
            n_error_buf[i][idim] = neb[n-1];
        }
    }
#endif

    // Read in the refinement ratio IntVects as integer AMREX_SPACEDIM-tuples.
    if (max_level > 0)
    {
        const int nratios_vect = max_level*AMREX_SPACEDIM;

        Vector<int> ratios_vect(nratios_vect);

        int got_vect = pp.queryarr("ref_ratio_vect",ratios_vect,0,nratios_vect);

        Vector<int> ratios;

        const int got_int = pp.queryarr("ref_ratio",ratios);

        if (got_int == 1 && got_vect == 1)
        {
            amrex::Abort("Only input *either* ref_ratio or ref_ratio_vect");
        }
        else if (got_vect == 1)
        {
            int k = 0;
            for (int i = 0; i < max_level; i++)
            {
                for (int n = 0; n < AMREX_SPACEDIM; n++,k++)
                    ref_ratio[i][n] = ratios_vect[k];
            }
        }
        else if (got_int == 1)
        {
            const int ncnt = ratios.size();
            for (int i = 0; i < ncnt && i < max_level; ++i)
            {
                for (int n = 0; n < AMREX_SPACEDIM; n++) {
                    ref_ratio[i][n] = ratios[i];
                }
            }
            for (int i = ncnt; i < max_level; ++i)
            {
                for (int n = 0; n < AMREX_SPACEDIM; n++) {
                    ref_ratio[i][n] = ratios.back();
                }
            }
        }
        else
        {
            if (verbose) {
                amrex::Print() << "Using default ref_ratio = 2 at all levels\n";
            }
        }
    }
    //if sent in, this wins over everything.
    if(a_refrat.size() > 0)
    {
      for (int i = 0; i < max_level; i++)
      {
          ref_ratio[i] = a_refrat[i];
      }
    }

    // Read in max_grid_size.  Use defaults if not explicitly defined.
    cnt = pp.countval("max_grid_size");
    if (cnt > 0) {
        Vector<int> mgs;
        pp.getarr("max_grid_size",mgs);
        int last_mgs = mgs.back();
        mgs.resize(max_level+1,last_mgs);
        SetMaxGridSize(mgs);
    }

    cnt = pp.countval("max_grid_size_x");
    if (cnt > 0) {
        int idim = 0;
        Vector<int> mgs;
        pp.getarr("max_grid_size_x",mgs);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            max_grid_size[i][idim] = mgs[i];
        }
        for (int i = n; i <= max_level; ++i) {
            max_grid_size[i][idim] = mgs[n-1];
        }
    }

#if (AMREX_SPACEDIM > 1)
    cnt = pp.countval("max_grid_size_y");
    if (cnt > 0) {
        int idim = 1;
        Vector<int> mgs;
        pp.getarr("max_grid_size_y",mgs);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            max_grid_size[i][idim] = mgs[i];
        }
        for (int i = n; i <= max_level; ++i) {
            max_grid_size[i][idim] = mgs[n-1];
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    cnt = pp.countval("max_grid_size_z");
    if (cnt > 0) {
        int idim = 2;
        Vector<int> mgs;
        pp.getarr("max_grid_size_z",mgs);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            max_grid_size[i][idim] = mgs[i];
        }
        for (int i = n; i <= max_level; ++i) {
            max_grid_size[i][idim] = mgs[n-1];
        }
    }
#endif

    // Read in the blocking_factors.  Use defaults if not explicitly defined.
    cnt = pp.countval("blocking_factor");
    if (cnt > 0) {
        Vector<int> bf;
        pp.getarr("blocking_factor",bf);
        int last_bf = bf.back();
        bf.resize(max_level+1,last_bf);
        SetBlockingFactor(bf);
    }

    cnt = pp.countval("blocking_factor_x");
    if (cnt > 0) {
        int idim = 0;
        Vector<int> bf;
        pp.getarr("blocking_factor_x",bf);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            blocking_factor[i][idim] = bf[i];
        }
        for (int i = n; i <= max_level; ++i) {
            blocking_factor[i][idim] = bf[n-1];
        }
    }

#if (AMREX_SPACEDIM > 1)
    cnt = pp.countval("blocking_factor_y");
    if (cnt > 0) {
        int idim = 1;
        Vector<int> bf;
        pp.getarr("blocking_factor_y",bf);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            blocking_factor[i][idim] = bf[i];
        }
        for (int i = n; i <= max_level; ++i) {
            blocking_factor[i][idim] = bf[n-1];
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    cnt = pp.countval("blocking_factor_z");
    if (cnt > 0) {
        int idim = 2;
        Vector<int> bf;
        pp.getarr("blocking_factor_z",bf);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            blocking_factor[i][idim] = bf[i];
        }
        for (int i = n; i <= max_level; ++i) {
            blocking_factor[i][idim] = bf[n-1];
        }
    }
#endif

    // Read computational domain and set geometry.
    {
        Vector<int> n_cell(AMREX_SPACEDIM);
        if (n_cell_in[0] == -1)
        {
            pp.getarr("n_cell",n_cell,0,AMREX_SPACEDIM);
        }
        else
        {
            for (int i = 0; i < AMREX_SPACEDIM; i++) n_cell[i] = n_cell_in[i];
        }

        IntVect lo(IntVect::TheZeroVector()), hi(n_cell);
        hi -= IntVect::TheUnitVector();
        Box index_domain(lo,hi);
        for (int i = 0; i <= max_level; i++)
        {
            geom[i].define(index_domain, rb, coord, is_per);
            if (i < max_level) {
                index_domain.refine(ref_ratio[i]);
            }
        }
    }

    //chop up grids to have the number of grids be no less the number of procs
    {
        pp.queryAdd("refine_grid_layout", refine_grid_layout);

        refine_grid_layout_dims = IntVect(refine_grid_layout);
        AMREX_D_TERM(pp.queryAdd("refine_grid_layout_x", refine_grid_layout_dims[0]);,
                     pp.queryAdd("refine_grid_layout_y", refine_grid_layout_dims[1]);,
                     pp.queryAdd("refine_grid_layout_z", refine_grid_layout_dims[2]));

        refine_grid_layout = refine_grid_layout_dims != 0;
    }

    pp.queryAdd("check_input", check_input);

    finest_level = -1;

    if (check_input) checkInput();
}